

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O2

path * __thiscall boost::filesystem::path::root_name(path *__return_storage_ptr__,path *this)

{
  iterator itr;
  iterator local_48;
  
  begin(&local_48,this);
  if ((((local_48.m_pos == (this->m_pathname)._M_string_length) ||
       (local_48.m_element.m_pathname._M_string_length < 2)) ||
      (*local_48.m_element.m_pathname._M_dataplus._M_p != '/')) ||
     (local_48.m_element.m_pathname._M_dataplus._M_p[1] != '/')) {
    (__return_storage_ptr__->m_pathname)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_pathname).field_2;
    (__return_storage_ptr__->m_pathname)._M_string_length = 0;
    (__return_storage_ptr__->m_pathname).field_2._M_local_buf[0] = '\0';
  }
  else {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&local_48);
  }
  std::__cxx11::string::~string((string *)&local_48);
  return __return_storage_ptr__;
}

Assistant:

path path::root_name() const
  {
    iterator itr(begin());

    return (itr.m_pos != m_pathname.size()
      && (
          (itr.m_element.m_pathname.size() > 1
            && is_separator(itr.m_element.m_pathname[0])
            && is_separator(itr.m_element.m_pathname[1])
   )
#       ifdef BOOST_WINDOWS_API
        || itr.m_element.m_pathname[itr.m_element.m_pathname.size()-1] == colon
#       endif
  ))
      ? itr.m_element
      : path();
  }